

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.h
# Opt level: O1

CellRelation
S2ShapeIndex::IteratorBase::LocateImpl<MutableS2ShapeIndex::Iterator>(S2CellId target,Iterator *it)

{
  ulong uVar1;
  __pointer_type pSVar2;
  CellRelation CVar3;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar4;
  node_type *pnVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  const_iterator cVar11;
  S2CellId local_28;
  
  uVar8 = ~target.id_ & target.id_ - 1;
  local_28.id_ = target.id_ - uVar8;
  cVar11 = gtl::internal_btree::
           btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
           ::lower_bound<S2CellId>
                     ((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                       *)&it->index_->cell_map_,&local_28);
  pbVar4 = cVar11.node;
  (it->iter_).node = pbVar4;
  iVar7 = cVar11.position;
  (it->iter_).position = iVar7;
  if ((pbVar4 == (it->end_).node) && (iVar7 == (it->end_).position)) {
    (it->super_IteratorBase).id_.id_ = 0xffffffffffffffff;
    (it->super_IteratorBase).cell_._M_b._M_p = (__pointer_type)0x0;
  }
  else {
    if (((undefined1  [16])cVar11 & (undefined1  [16])0x7) != (undefined1  [16])0x0)
    goto LAB_001965ff;
    pSVar2 = *(__pointer_type *)(pbVar4 + (long)iVar7 * 0x10 + 0x18);
    (it->super_IteratorBase).id_.id_ = *(uint64 *)(pbVar4 + (long)iVar7 * 0x10 + 0x10);
    (it->super_IteratorBase).cell_._M_b._M_p = pSVar2;
  }
  uVar1 = (it->super_IteratorBase).id_.id_;
  if (uVar1 == 0xffffffffffffffff) {
LAB_00196564:
    pnVar5 = gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
             ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                         *)&it->index_->cell_map_);
    bVar9 = (it->iter_).node != pnVar5;
    bVar10 = (it->iter_).position != 0;
    if (bVar10 || bVar9) {
      gtl::internal_btree::
      btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
      ::decrement(&it->iter_);
      pbVar4 = (it->iter_).node;
      iVar7 = (it->iter_).position;
      if ((pbVar4 == (it->end_).node) && (iVar7 == (it->end_).position)) {
        (it->super_IteratorBase).id_.id_ = 0xffffffffffffffff;
        (it->super_IteratorBase).cell_._M_b._M_p = (__pointer_type)0x0;
      }
      else {
        if (((ulong)pbVar4 & 7) != 0) {
LAB_001965ff:
          __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                        ,0x1e1,
                        "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                       );
        }
        lVar6 = (long)iVar7 * 0x10;
        pSVar2 = *(__pointer_type *)&pbVar4[lVar6 + 0x18].field_0x0;
        (it->super_IteratorBase).id_.id_ = *(uint64 *)(pbVar4 + lVar6 + 0x10);
        (it->super_IteratorBase).cell_._M_b._M_p = pSVar2;
      }
      if ((bVar10 || bVar9) &&
         (uVar8 = (it->super_IteratorBase).id_.id_, target.id_ <= (uVar8 - 1 | uVar8)))
      goto LAB_001965f2;
    }
    CVar3 = DISJOINT;
  }
  else {
    if ((uVar1 < target.id_) || (target.id_ < uVar1 - (~uVar1 & uVar1 - 1))) {
      if (uVar1 <= uVar8 + target.id_) {
        return SUBDIVIDED;
      }
      goto LAB_00196564;
    }
LAB_001965f2:
    CVar3 = INDEXED;
  }
  return CVar3;
}

Assistant:

inline S2ShapeIndex::CellRelation
S2ShapeIndex::IteratorBase::LocateImpl(S2CellId target, Iter* it) {
  // Let T be the target, let I = cell_map_->lower_bound(T.range_min()), and
  // let I' be the predecessor of I.  If T contains any index cells, then T
  // contains I.  Similarly, if T is contained by an index cell, then the
  // containing cell is either I or I'.  We test for containment by comparing
  // the ranges of leaf cells spanned by T, I, and I'.

  it->Seek(target.range_min());
  if (!it->done()) {
    if (it->id() >= target && it->id().range_min() <= target) return INDEXED;
    if (it->id() <= target.range_max()) return SUBDIVIDED;
  }
  if (it->Prev() && it->id().range_max() >= target) return INDEXED;
  return DISJOINT;
}